

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfft_host.c
# Opt level: O0

void mpifftnd_dif(int *dim,int *pdim,int ndim,int *pidx,int inv,int size_in,int *inembed,int *oembed
                 ,cpx_t *work,cpx_t *scratch,plan_t *plans_short,plan_t *plans_long,int **rho_L,
                 int **rho_pk0,int **rho_Lk0,int *dfft_nsend,int *dfft_nrecv,int *dfft_offset_send,
                 int *dfft_offset_recv,MPI_Comm comm,int *proc_map,int row_m)

{
  int iVar1;
  int iVar2;
  int iVar3;
  plan_t plan_short;
  plan_t plan_long;
  undefined8 in_RCX;
  int in_EDX;
  int *in_RSI;
  long in_RDI;
  undefined4 in_R8D;
  int in_R9D;
  int unaff_retaddr;
  int *in_stack_00000008;
  cpx_t *in_stack_00000010;
  cpx_t *in_stack_00000018;
  long in_stack_00000020;
  undefined8 in_stack_00000028;
  undefined8 in_stack_00000030;
  undefined8 in_stack_00000038;
  undefined8 in_stack_00000040;
  undefined8 in_stack_00000048;
  int *in_stack_00000050;
  int *in_stack_00000058;
  int *in_stack_00000060;
  int *in_stack_00000068;
  int *in_stack_00000070;
  int *in_stack_00000078;
  undefined4 in_stack_00000080;
  undefined4 in_stack_00000084;
  MPI_Comm in_stack_00000088;
  int *in_stack_00000090;
  int in_stack_00000098;
  int new_idx;
  int gidx;
  int j;
  int i;
  int stride;
  int l;
  int current_dim;
  int size;
  int local_a0;
  int local_9c;
  int local_60;
  int iVar4;
  undefined4 in_stack_ffffffffffffffb8;
  
  iVar4 = in_R9D;
  for (local_60 = 0; local_60 < in_EDX; local_60 = local_60 + 1) {
    plan_short._8_8_ = in_stack_00000028;
    plan_short._0_8_ = in_stack_00000020;
    plan_short._16_8_ = in_stack_00000030;
    plan_long._8_8_ = in_stack_00000040;
    plan_long._0_8_ = in_stack_00000038;
    plan_long._16_8_ = in_stack_00000048;
    mpifft1d_dif(in_RSI,(int *)CONCAT44(in_EDX,in_stack_ffffffffffffffb8),
                 (int)((ulong)in_RCX >> 0x20),(int)in_RCX,(int *)CONCAT44(in_R8D,iVar4),in_R9D,
                 unaff_retaddr,in_stack_00000008,in_stack_00000010,in_stack_00000018,plan_short,
                 plan_long,in_stack_00000050,in_stack_00000058,in_stack_00000060,in_stack_00000068,
                 in_stack_00000070,in_stack_00000078,
                 (int *)CONCAT44(in_stack_00000084,in_stack_00000080),in_stack_00000088,
                 in_stack_00000090,in_stack_00000098);
    iVar1 = *(int *)(in_RDI + (long)local_60 * 4);
    iVar2 = in_RSI[local_60];
    iVar3 = in_stack_00000008[local_60];
    for (local_9c = 0; local_9c < iVar1 / iVar2; local_9c = local_9c + 1) {
      for (local_a0 = 0; local_a0 < in_R9D / iVar3; local_a0 = local_a0 + 1) {
        in_stack_00000018[local_a0 * (int)(&in_stack_00000010->x)[local_60] + local_9c] =
             *(cpx_t *)(in_stack_00000020 + (long)(local_a0 + local_9c * (in_R9D / iVar3)) * 8);
      }
    }
    in_R9D = ((int)(&in_stack_00000010->x)[local_60] * in_R9D) / in_stack_00000008[local_60];
  }
  return;
}

Assistant:

void mpifftnd_dif(int *dim,
            int *pdim,
            int ndim,
            int* pidx,
            int inv,
            int size_in,
            int *inembed,
            int *oembed,
            cpx_t *work,
            cpx_t *scratch,
            plan_t *plans_short,
            plan_t *plans_long,
            int **rho_L,
            int **rho_pk0,
            int **rho_Lk0,
            int *dfft_nsend,
            int *dfft_nrecv,
            int *dfft_offset_send,
            int *dfft_offset_recv,
            MPI_Comm comm,
            int *proc_map,
            int row_m)
    {
    int size = size_in;
    int current_dim;
    for (current_dim = 0; current_dim < ndim; ++current_dim)
        {
        /* assume input in local column major */
        mpifft1d_dif(dim, pdim,ndim,current_dim,pidx, inv,
            size, inembed, work, scratch, plans_short[current_dim],
            plans_long[current_dim], rho_L[current_dim],
            rho_pk0[current_dim],rho_Lk0[current_dim],
            dfft_nsend,dfft_nrecv,dfft_offset_send,dfft_offset_recv,
            comm,proc_map, row_m);

        int l = dim[current_dim]/pdim[current_dim];
        int stride = size/inembed[current_dim];

        /* transpose local matrix */
        int i;
        #pragma omp parallel for private(i)
        for (i = 0; i < l; ++i)
            {
            int j;
            for (j = 0; j < stride; ++j)
                {
                int gidx = j+i*stride;
                int new_idx = j*oembed[current_dim]+i;
                work[new_idx] = scratch[gidx];
                }
            }

        /* update size */
        size *= oembed[current_dim];
        size /= inembed[current_dim];
        }
    }